

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall IntegerType::fromBuffer(IntegerType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  uint local_40;
  short local_3a;
  uint32_t tempVal;
  unsigned_short tempLength;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  IntegerType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    local_40 = 0;
    _tempVal = buf + this_local._4_4_;
    for (local_3a = (short)(this->super_BER_CONTAINER)._length; local_3a != 0;
        local_3a = local_3a + -1) {
      local_40 = local_40 << 8 | (uint)*_tempVal;
      _tempVal = _tempVal + 1;
    }
    iVar1 = (this->super_BER_CONTAINER)._length;
    if (iVar1 == 1) {
      this->_value = (int)(char)local_40;
    }
    else if (iVar1 == 2) {
      this->_value = (int)(short)local_40;
    }
    else if (iVar1 == 3) {
      if ((local_40 & 0x800000) != 0) {
        local_40 = local_40 | 0xff000000;
      }
      this->_value = local_40;
    }
    else {
      this->_value = local_40;
    }
    this_local._4_4_ = (int)_tempVal - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int IntegerType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    unsigned short tempLength = _length;
    uint32_t tempVal = 0; 

    while(tempLength > 0){
        tempVal = tempVal << 8;
        tempVal = tempVal | *ptr++;
        tempLength--;
    }

    switch(_length){
        case 1:
            _value = (int8_t)tempVal;
        break;
        case 2:
            _value = (int16_t)tempVal;
        break;
        case 3:
            if(tempVal & 0x00800000){
                tempVal = tempVal |= 0xFF000000;
            }
            _value = (int32_t)tempVal;
        break;
        default:
            _value = (int32_t)tempVal;
    }
    
    return ptr - buf;
}